

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::Function::RegisterFunctionParameter
          (Function *this,uint32_t parameter_id,uint32_t type_id)

{
  if (this->current_block_ == (BasicBlock *)0x0) {
    return SPV_SUCCESS;
  }
  __assert_fail("current_block_ == nullptr && \"RegisterFunctionParameter can only be called when parsing the binary \" \"outside of a block\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/function.cpp"
                ,0x3b,
                "spv_result_t spvtools::val::Function::RegisterFunctionParameter(uint32_t, uint32_t)"
               );
}

Assistant:

spv_result_t Function::RegisterFunctionParameter(uint32_t parameter_id,
                                                 uint32_t type_id) {
  assert(current_block_ == nullptr &&
         "RegisterFunctionParameter can only be called when parsing the binary "
         "outside of a block");
  // TODO(umar): Validate function parameter type order and count
  // TODO(umar): Use these variables to validate parameter type
  (void)parameter_id;
  (void)type_id;
  return SPV_SUCCESS;
}